

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O0

void aec_get_rsi_msb_24(aec_stream *strm)

{
  uint32_t *puVar1;
  uchar *puVar2;
  int iVar3;
  int local_28;
  int i;
  int rsi;
  uchar *in;
  uint32_t *out;
  aec_stream *strm_local;
  
  puVar1 = strm->state->data_raw;
  puVar2 = strm->next_in;
  iVar3 = strm->rsi * strm->block_size;
  for (local_28 = 0; local_28 < iVar3; local_28 = local_28 + 1) {
    puVar1[local_28] =
         (uint)puVar2[local_28 * 3] << 0x10 | (uint)puVar2[local_28 * 3 + 1] << 8 |
         (uint)puVar2[local_28 * 3 + 2];
  }
  strm->next_in = strm->next_in + iVar3 * 3;
  strm->avail_in = strm->avail_in - (long)(iVar3 * 3);
  return;
}

Assistant:

void aec_get_rsi_msb_24(struct aec_stream *strm)
{
    uint32_t *restrict out = strm->state->data_raw;
    const unsigned char *restrict in = strm->next_in;
    int rsi = strm->rsi * strm->block_size;

    for (int i = 0; i < rsi; i++)
        out[i] = ((uint32_t)in[3 * i] << 16)
            | ((uint32_t)in[3 * i + 1] << 8)
            | (uint32_t)in[3 * i + 2];

    strm->next_in += 3 * rsi;
    strm->avail_in -= 3 * rsi;
}